

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.h
# Opt level: O0

void __thiscall shift_window_transformer::Linear<float>::~Linear(Linear<float> *this)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  Linear<float> *this_local;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0011c978;
  if (this->weights != (vector<float,_std::allocator<float>_> *)0x0) {
    pvVar1 = this->weights;
    if (pvVar1 != (vector<float,_std::allocator<float>_> *)0x0) {
      std::vector<float,_std::allocator<float>_>::~vector(pvVar1);
      operator_delete(pvVar1,0x18);
    }
    this->weights = (vector<float,_std::allocator<float>_> *)0x0;
  }
  if (this->bias != (vector<float,_std::allocator<float>_> *)0x0) {
    pvVar1 = this->bias;
    if (pvVar1 != (vector<float,_std::allocator<float>_> *)0x0) {
      std::vector<float,_std::allocator<float>_>::~vector(pvVar1);
      operator_delete(pvVar1,0x18);
    }
    this->bias = (vector<float,_std::allocator<float>_> *)0x0;
  }
  return;
}

Assistant:

~Linear() {
            if (weights != nullptr) {
                delete weights;
                weights = nullptr;
            }
            if (bias != nullptr) {
                delete bias;
                bias = nullptr;
            }
        }